

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O3

bool __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>::factorise
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *this,
          Matrix_Dense<double,_0UL,_0UL> *a_matrix)

{
  ulong uVar1;
  pointer pVVar2;
  pointer pdVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  this->factorised = false;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  operator=(&(this->lu_factorised).
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ,&a_matrix->
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           );
  pVVar2 = (this->lu_factorised).
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           .
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->lu_factorised).
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                .
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2;
  if (lVar6 == 0) {
    bVar12 = true;
LAB_0010cf2e:
    this->factorised = true;
  }
  else {
    uVar5 = (lVar6 >> 3) * -0x5555555555555555;
    pdVar7 = *(double **)
              &(pVVar2->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>;
    if (this->factorisation_tolerance <= ABS(*pdVar7)) {
      pdVar8 = pdVar7;
      uVar9 = 0;
      do {
        uVar1 = uVar9 + 1;
        if (uVar1 < uVar5) {
          pdVar3 = *(pointer *)
                    ((long)&(pVVar2->super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_> + 8);
          lVar6 = *(long *)&(pVVar2->super_vector<double,_std::allocator<double>_>).
                            super__Vector_base<double,_std::allocator<double>_>;
          uVar10 = uVar1;
          do {
            lVar4 = *(long *)&pVVar2[uVar10].super_vector<double,_std::allocator<double>_>;
            *(double *)(lVar4 + uVar9 * 8) = *(double *)(lVar4 + uVar9 * 8) / *pdVar7;
            for (uVar11 = uVar1; uVar11 < (ulong)((long)pdVar3 - lVar6 >> 3); uVar11 = uVar11 + 1) {
              *(double *)(lVar4 + uVar11 * 8) =
                   *(double *)(lVar4 + uVar11 * 8) - *(double *)(lVar4 + uVar9 * 8) * pdVar8[uVar11]
              ;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar5);
        }
        if (uVar1 == uVar5 + (uVar5 == 0)) {
          bVar12 = uVar5 <= uVar1;
          goto LAB_0010cf2e;
        }
        pdVar8 = *(double **)&pVVar2[uVar1].super_vector<double,_std::allocator<double>_>;
        pdVar7 = pdVar8 + uVar1;
        uVar9 = uVar1;
      } while (this->factorisation_tolerance <= ABS(*pdVar7));
      bVar12 = uVar5 <= uVar1;
    }
    else {
      bVar12 = false;
    }
  }
  return bVar12;
}

Assistant:

bool Direct_Lower_Upper_Factorisation<_solver_type, _size, _pivot>::factorise(
const Matrix_Dense<Scalar, _size, _size>& a_matrix) {

  // Initialise factorisation data.
  factorised = false;
  lu_factorised = a_matrix;
  if(_pivot) {
    pivots.resize(lu_factorised.size_column());
    std::iota(pivots.begin(), pivots.end(), 0);
  }

  // Factorise A into L and U.
  for(std::size_t i_row = 0; i_row < lu_factorised.size_row(); ++i_row) {

    // Pivoting
    if(_pivot) {

      // Find largest remaining column value to pivot on.
      Scalar max = 0.0;
      std::size_t i_max = i_row;
      for(std::size_t i_row_sweep = i_row; i_row_sweep < lu_factorised.size_column(); ++i_row_sweep) {
        const Scalar absA = std::abs(lu_factorised[i_row_sweep][i_row]);
        if(is_nearly_greater(absA, max)) {
          max = absA;
          i_max = i_row_sweep;
        }
      }

      // Pivot if larger value found.
      if(i_max != i_row) {
        std::swap(pivots[i_row], pivots[i_max]);
        std::swap(lu_factorised[i_row], lu_factorised[i_max]);
      }
    }

    // Check degeneracy.
    if(std::abs(lu_factorised[i_row][i_row]) < factorisation_tolerance) return false;

    // Decomposition, actual factorisation to compute L and U.
    for(std::size_t i_row_sweep = i_row + 1; i_row_sweep < lu_factorised.size_row(); ++i_row_sweep) {
      lu_factorised[i_row_sweep][i_row] /= lu_factorised[i_row][i_row];

      for(std::size_t i_column_sweep = i_row + 1; i_column_sweep < lu_factorised.size_column(); ++i_column_sweep)
        lu_factorised[i_row_sweep][i_column_sweep] -=
        lu_factorised[i_row_sweep][i_row] * lu_factorised[i_row][i_column_sweep];
    }
  }

  factorised = true;
  return true;
}